

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::ErrnoLogMessage::ErrnoLogMessage
          (ErrnoLogMessage *this,char *file,int line,LogSeverity severity,int64 ctr,
          SendMethod send_method)

{
  SendMethod in_stack_00000008;
  SendMethod send_method_local;
  int64 ctr_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  ErrnoLogMessage *this_local;
  
  LogMessage::LogMessage(&this->super_LogMessage,file,line,severity,ctr,in_stack_00000008);
  return;
}

Assistant:

ErrnoLogMessage::ErrnoLogMessage(const char* file, int line,
                                 LogSeverity severity, int64 ctr,
                                 void (LogMessage::*send_method)())
    : LogMessage(file, line, severity, ctr, send_method) {}